

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  short sVar1;
  uchar *puVar2;
  ushort uVar3;
  stbtt_vertex *__ptr;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  stbtt_vertex *psVar7;
  ushort *puVar8;
  size_t sVar9;
  stbtt_vertex *__dest;
  uint uVar10;
  int iVar11;
  short sVar12;
  int was_off;
  uint uVar13;
  stbtt_fontinfo *psVar14;
  long lVar15;
  byte bVar16;
  byte bVar17;
  ushort uVar18;
  short sVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  stbtt_vertex *local_88;
  stbtt_vertex *comp_verts;
  ulong local_78;
  stbtt_fontinfo *local_70;
  ulong local_68;
  undefined8 local_60;
  stbtt_vertex *local_58;
  uint local_4c;
  ushort *local_48;
  ulong local_40;
  undefined8 local_38;
  ulong uVar23;
  
  puVar2 = info->data;
  uVar4 = stbtt__GetGlyfOffset(info,glyph_index);
  *pvertices = (stbtt_vertex *)0x0;
  uVar10 = 0;
  if (-1 < (int)uVar4) {
    uVar6 = (ulong)uVar4;
    uVar3 = CONCAT11(puVar2[uVar6],puVar2[uVar6 + 1]);
    if ((short)uVar3 < 1) {
      if (uVar3 == 0xffff) {
        psVar7 = (stbtt_vertex *)0x0;
        uVar10 = 0;
        puVar8 = (ushort *)(puVar2 + uVar6 + 10);
        local_70 = info;
        do {
          local_88 = (stbtt_vertex *)0x0;
          bVar17 = *(byte *)((long)puVar8 + 1);
          uVar4 = (uint)bVar17;
          if ((bVar17 & 2) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                          ,0x58d,
                          "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
          }
          if ((bVar17 & 1) == 0) {
            iVar20 = (int)(char)puVar8[2];
            iVar5 = (int)*(char *)((long)puVar8 + 5);
            lVar15 = 6;
          }
          else {
            iVar20 = (int)CONCAT11((char)puVar8[2],*(undefined1 *)((long)puVar8 + 5));
            iVar5 = (int)(short)(puVar8[3] << 8 | puVar8[3] >> 8);
            lVar15 = 8;
          }
          local_48 = (ushort *)(lVar15 + (long)puVar8);
          local_68 = CONCAT44(local_68._4_4_,(float)iVar20);
          local_58 = (stbtt_vertex *)CONCAT44(local_58._4_4_,(float)iVar5);
          if ((bVar17 & 8) == 0) {
            if ((bVar17 & 0x40) == 0) {
              if ((char)bVar17 < '\0') {
                local_78 = CONCAT44(local_78._4_4_,
                                    (float)(int)(short)(*local_48 << 8 | *local_48 >> 8) *
                                    6.1035156e-05);
                local_38 = CONCAT44(local_38._4_4_,
                                    (float)(int)(short)(local_48[1] << 8 | local_48[1] >> 8) *
                                    6.1035156e-05);
                local_60 = CONCAT44(local_60._4_4_,
                                    (float)(int)(short)(local_48[2] << 8 | local_48[2] >> 8) *
                                    6.1035156e-05);
                local_40 = CONCAT44(local_40._4_4_,
                                    (float)(int)(short)(local_48[3] << 8 | local_48[3] >> 8) *
                                    6.1035156e-05);
                local_48 = local_48 + 4;
              }
              else {
                local_60 = (ulong)local_60._4_4_ << 0x20;
                local_40 = CONCAT44(local_40._4_4_,0x3f800000);
                local_38 = (ulong)local_38._4_4_ << 0x20;
                local_78 = CONCAT44(local_78._4_4_,0x3f800000);
              }
            }
            else {
              local_78 = CONCAT44(local_78._4_4_,
                                  (float)(int)(short)(*local_48 << 8 | *local_48 >> 8) *
                                  6.1035156e-05);
              local_40 = CONCAT44(local_40._4_4_,
                                  (float)(int)(short)(local_48[1] << 8 | local_48[1] >> 8) *
                                  6.1035156e-05);
              local_48 = local_48 + 2;
              local_60 = (ulong)local_60._4_4_ << 0x20;
              local_38 = (ulong)local_38._4_4_ << 0x20;
            }
          }
          else {
            fVar24 = (float)(int)(short)(*local_48 << 8 | *local_48 >> 8) * 6.1035156e-05;
            local_48 = local_48 + 1;
            local_60 = (ulong)local_60._4_4_ << 0x20;
            local_38 = (ulong)local_38._4_4_ << 0x20;
            local_40 = CONCAT44(local_40._4_4_,fVar24);
            local_78 = CONCAT44(local_78._4_4_,fVar24);
          }
          uVar13 = stbtt_GetGlyphShape(info,(uint)(ushort)(puVar8[1] << 8 | puVar8[1] >> 8),
                                       &local_88);
          __ptr = local_88;
          if (0 < (int)uVar13) {
            local_4c = (uint)bVar17;
            fVar24 = SQRT((float)local_78 * (float)local_78 + (float)local_38 * (float)local_38);
            fVar25 = SQRT((float)local_60 * (float)local_60 + (float)local_40 * (float)local_40);
            sVar9 = 0;
            do {
              fVar26 = (float)(int)*(short *)((long)&local_88->x + sVar9);
              fVar27 = (float)(int)*(short *)((long)&local_88->y + sVar9);
              *(short *)((long)&local_88->x + sVar9) =
                   (short)(int)(((float)local_78 * fVar26 + (float)local_60 * fVar27 +
                                (float)local_68) * fVar24);
              *(short *)((long)&local_88->y + sVar9) =
                   (short)(int)((fVar26 * (float)local_38 + fVar27 * (float)local_40 +
                                local_58._0_4_) * fVar25);
              fVar26 = (float)(int)*(short *)((long)&local_88->cx + sVar9);
              fVar27 = (float)(int)*(short *)((long)&local_88->cy + sVar9);
              *(short *)((long)&local_88->cx + sVar9) =
                   (short)(int)(((float)local_78 * fVar26 + (float)local_60 * fVar27 +
                                (float)local_68) * fVar24);
              *(short *)((long)&local_88->cy + sVar9) =
                   (short)(int)((fVar26 * (float)local_38 + fVar27 * (float)local_40 +
                                local_58._0_4_) * fVar25);
              sVar9 = sVar9 + 10;
            } while ((ulong)uVar13 * 10 != sVar9);
            __dest = (stbtt_vertex *)malloc((ulong)(uVar13 + uVar10) * 10);
            if (__dest == (stbtt_vertex *)0x0) {
              if (psVar7 != (stbtt_vertex *)0x0) {
                free(psVar7);
              }
              free(__ptr);
              return 0;
            }
            local_58 = __dest;
            if (0 < (int)uVar10) {
              memcpy(__dest,psVar7,(ulong)uVar10 * 10);
            }
            memcpy(local_58 + uVar10,__ptr,(ulong)uVar13 * 10);
            if (psVar7 != (stbtt_vertex *)0x0) {
              free(psVar7);
            }
            free(__ptr);
            info = local_70;
            psVar7 = local_58;
            uVar10 = uVar13 + uVar10;
            uVar4 = local_4c;
          }
          puVar8 = local_48;
        } while ((uVar4 & 0x20) != 0);
      }
      else {
        if ((short)((ushort)puVar2[uVar6] << 8) < 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                        ,0x5c2,
                        "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
        }
        uVar10 = 0;
        psVar7 = (stbtt_vertex *)0x0;
      }
    }
    else {
      psVar14 = (stbtt_fontinfo *)(ulong)((uint)uVar3 * 2);
      bVar17 = puVar2[(long)psVar14 + uVar6 + 10];
      local_68 = (ulong)puVar2[(long)psVar14 + uVar6 + 0xb];
      bVar16 = puVar2[(long)psVar14 + uVar6 + 8];
      local_48 = (ushort *)(ulong)puVar2[(long)psVar14 + uVar6 + 9];
      uVar10 = (uint)puVar2[(long)psVar14 + uVar6 + 9] + (uint)bVar16 * 0x100;
      local_78 = (ulong)uVar10;
      psVar7 = (stbtt_vertex *)malloc((ulong)((uVar10 + (uint)uVar3 * 2) * 10 + 10));
      if (psVar7 == (stbtt_vertex *)0x0) {
        return 0;
      }
      comp_verts = (stbtt_vertex *)(puVar2 + uVar6 + 10);
      puVar8 = (ushort *)(puVar2 + (ulong)bVar17 * 0x100 + local_68 + (long)psVar14 + uVar6 + 0xc);
      uVar6 = (ulong)psVar14 & 0xffff;
      local_48._0_4_ = (uint)bVar16 * 0x100 + (int)local_48;
      lVar15 = 0;
      bVar17 = 0;
      bVar16 = 0;
      do {
        if (bVar16 == 0) {
          bVar17 = (byte)*puVar8;
          if ((bVar17 & 8) == 0) {
            puVar8 = (ushort *)((long)puVar8 + 1);
            bVar16 = 0;
          }
          else {
            bVar16 = *(byte *)((long)puVar8 + 1);
            puVar8 = puVar8 + 1;
          }
        }
        else {
          bVar16 = bVar16 - 1;
        }
        (&psVar7[uVar6].type)[lVar15] = bVar17;
        lVar15 = lVar15 + 10;
      } while ((ulong)((int)local_48 * 2 + 2) * 5 != lVar15);
      lVar15 = 0;
      sVar19 = 0;
      do {
        bVar17 = (&psVar7[uVar6].type)[lVar15];
        if ((bVar17 & 2) == 0) {
          if ((bVar17 & 0x10) == 0) {
            sVar19 = sVar19 + (*puVar8 << 8 | *puVar8 >> 8);
            puVar8 = puVar8 + 1;
          }
        }
        else {
          uVar3 = *puVar8;
          puVar8 = (ushort *)((long)puVar8 + 1);
          uVar18 = -(ushort)(byte)uVar3;
          if ((bVar17 & 0x10) != 0) {
            uVar18 = (ushort)(byte)uVar3;
          }
          sVar19 = sVar19 + uVar18;
        }
        *(short *)((long)&psVar7[uVar6].x + lVar15) = sVar19;
        lVar15 = lVar15 + 10;
      } while ((ulong)((int)local_48 * 2 + 2) * 5 != lVar15);
      lVar15 = 0;
      sVar19 = 0;
      do {
        bVar17 = (&psVar7[uVar6].type)[lVar15];
        if ((bVar17 & 4) == 0) {
          if ((bVar17 & 0x20) == 0) {
            sVar19 = sVar19 + (*puVar8 << 8 | *puVar8 >> 8);
            puVar8 = puVar8 + 1;
          }
        }
        else {
          uVar3 = *puVar8;
          puVar8 = (ushort *)((long)puVar8 + 1);
          uVar18 = -(ushort)(byte)uVar3;
          if ((bVar17 & 0x20) != 0) {
            uVar18 = (ushort)(byte)uVar3;
          }
          sVar19 = sVar19 + uVar18;
        }
        *(short *)((long)&psVar7[uVar6].y + lVar15) = sVar19;
        lVar15 = lVar15 + 10;
      } while ((ulong)((int)local_48 * 2 + 2) * 5 != lVar15);
      iVar5 = 0;
      iVar20 = 0;
      local_60 = 0;
      iVar11 = 0;
      local_68 = 0;
      local_48 = (ushort *)0x0;
      uVar4 = 0;
      uVar10 = 0;
      local_38 = 0;
      local_40 = 0;
      local_4c = 0;
      was_off = 0;
      local_70 = psVar14;
      local_58 = psVar7;
      do {
        lVar15 = (long)(iVar20 + (int)psVar14);
        bVar17 = psVar7[lVar15].type;
        sVar19 = psVar7[lVar15].x;
        sVar1 = psVar7[lVar15].y;
        uVar22 = (uint)sVar19;
        uVar23 = (ulong)uVar22;
        uVar13 = (uint)sVar1;
        uVar6 = (ulong)uVar13;
        if (iVar11 == iVar20) {
          if (iVar20 != 0) {
            iVar5 = stbtt__close_shape(psVar7,iVar5,was_off,local_4c,uVar10,uVar4,
                                       (stbtt_int32)local_48,(stbtt_int32)local_68,(int)local_40,
                                       (int)local_38);
          }
          uVar10 = uVar22;
          uVar4 = uVar13;
          if ((bVar17 & 1) == 0) {
            local_68 = uVar6;
            local_48 = (ushort *)uVar23;
            if ((local_58[lVar15 + 1].type & 1) == 0) {
              uVar10 = (int)((int)local_58[lVar15 + 1].x + uVar22) >> 1;
              uVar4 = (int)((int)local_58[lVar15 + 1].y + uVar13) >> 1;
            }
            else {
              iVar20 = iVar20 + 1;
              uVar10 = (int)local_58[lVar15 + 1].x;
              uVar4 = (int)local_58[lVar15 + 1].y;
            }
          }
          local_4c = bVar17 & 1 ^ 1;
          local_58[iVar5].type = '\x01';
          local_58[iVar5].x = (short)uVar10;
          local_58[iVar5].y = (short)uVar4;
          local_58[iVar5].cx = 0;
          local_58[iVar5].cy = 0;
          iVar11 = (ushort)((&comp_verts->x)[(int)local_60] << 8 |
                           (ushort)(&comp_verts->x)[(int)local_60] >> 8) + 1;
          local_60 = (ulong)((int)local_60 + 1);
          was_off = 0;
          psVar7 = local_58;
          psVar14 = local_70;
          iVar21 = iVar20;
          iVar5 = iVar5 + 1;
        }
        else {
          sVar12 = (short)local_38;
          iVar21 = iVar20;
          if ((bVar17 & 1) == 0) {
            iVar20 = iVar5;
            if (was_off != 0) {
              iVar20 = iVar5 + 1;
              psVar7[iVar5].type = '\x03';
              psVar7[iVar5].x = (short)((int)local_40 + uVar22 >> 1);
              psVar7[iVar5].y = (short)(uVar13 + (int)local_38 >> 1);
              psVar7[iVar5].cx = (short)local_40;
              psVar7[iVar5].cy = sVar12;
            }
            was_off = 1;
            iVar5 = iVar20;
            local_40 = uVar23;
            local_38 = uVar6;
          }
          else {
            psVar7 = psVar7 + iVar5;
            if (was_off == 0) {
              psVar7->type = '\x02';
              psVar7->x = sVar19;
              psVar7->y = sVar1;
              psVar7->cx = 0;
              sVar12 = 0;
            }
            else {
              psVar7->type = '\x03';
              psVar7->x = sVar19;
              psVar7->y = sVar1;
              psVar7->cx = (short)local_40;
            }
            psVar7->cy = sVar12;
            iVar5 = iVar5 + 1;
            was_off = 0;
            psVar7 = local_58;
            psVar14 = local_70;
          }
        }
        iVar20 = iVar21 + 1;
      } while (iVar21 < (int)(float)local_78);
      uVar10 = stbtt__close_shape(psVar7,iVar5,was_off,local_4c,uVar10,uVar4,(stbtt_int32)local_48,
                                  (stbtt_int32)local_68,(stbtt_int32)local_40,(stbtt_int32)local_38)
      ;
      psVar7 = local_58;
    }
    *pvertices = psVar7;
  }
  return uVar10;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   stbtt_int16 numberOfContours;
   stbtt_uint8 *endPtsOfContours;
   stbtt_uint8 *data = info->data;
   stbtt_vertex *vertices=0;
   int num_vertices=0;
   int g = stbtt__GetGlyfOffset(info, glyph_index);

   *pvertices = NULL;

   if (g < 0) return 0;

   numberOfContours = ttSHORT(data + g);

   if (numberOfContours > 0) {
      stbtt_uint8 flags=0,flagcount;
      stbtt_int32 ins, i,j=0,m,n, next_move, was_off=0, off, start_off=0;
      stbtt_int32 x,y,cx,cy,sx,sy, scx,scy;
      stbtt_uint8 *points;
      endPtsOfContours = (data + g + 10);
      ins = ttUSHORT(data + g + 10 + numberOfContours * 2);
      points = data + g + 10 + numberOfContours * 2 + 2 + ins;

      n = 1+ttUSHORT(endPtsOfContours + numberOfContours*2-2);

      m = n + 2*numberOfContours;  // a loose bound on how many vertices we might need
      vertices = (stbtt_vertex *) STBTT_malloc(m * sizeof(vertices[0]), info->userdata);
      if (vertices == 0)
         return 0;

      next_move = 0;
      flagcount=0;

      // in first pass, we load uninterpreted data into the allocated array
      // above, shifted to the end of the array so we won't overwrite it when
      // we create our final data starting from the front

      off = m - n; // starting offset for uninterpreted data, regardless of how m ends up being calculated

      // first load flags

      for (i=0; i < n; ++i) {
         if (flagcount == 0) {
            flags = *points++;
            if (flags & 8)
               flagcount = *points++;
         } else
            --flagcount;
         vertices[off+i].type = flags;
      }

      // now load x coordinates
      x=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 2) {
            stbtt_int16 dx = *points++;
            x += (flags & 16) ? dx : -dx; // ???
         } else {
            if (!(flags & 16)) {
               x = x + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].x = (stbtt_int16) x;
      }

      // now load y coordinates
      y=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 4) {
            stbtt_int16 dy = *points++;
            y += (flags & 32) ? dy : -dy; // ???
         } else {
            if (!(flags & 32)) {
               y = y + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].y = (stbtt_int16) y;
      }

      // now convert them to our format
      num_vertices=0;
      sx = sy = cx = cy = scx = scy = 0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         x     = (stbtt_int16) vertices[off+i].x;
         y     = (stbtt_int16) vertices[off+i].y;

         if (next_move == i) {
            if (i != 0)
               num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);

            // now start the new one               
            start_off = !(flags & 1);
            if (start_off) {
               // if we start off with an off-curve point, then when we need to find a point on the curve
               // where we can start, and we need to save some state for when we wraparound.
               scx = x;
               scy = y;
               if (!(vertices[off+i+1].type & 1)) {
                  // next point is also a curve point, so interpolate an on-point curve
                  sx = (x + (stbtt_int32) vertices[off+i+1].x) >> 1;
                  sy = (y + (stbtt_int32) vertices[off+i+1].y) >> 1;
               } else {
                  // otherwise just use the next point as our start point
                  sx = (stbtt_int32) vertices[off+i+1].x;
                  sy = (stbtt_int32) vertices[off+i+1].y;
                  ++i; // we're using point i+1 as the starting point, so skip it
               }
            } else {
               sx = x;
               sy = y;
            }
            stbtt_setvertex(&vertices[num_vertices++], STBTT_vmove,sx,sy,0,0);
            was_off = 0;
            next_move = 1 + ttUSHORT(endPtsOfContours+j*2);
            ++j;
         } else {
            if (!(flags & 1)) { // if it's a curve
               if (was_off) // two off-curve control points in a row means interpolate an on-curve midpoint
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, (cx+x)>>1, (cy+y)>>1, cx, cy);
               cx = x;
               cy = y;
               was_off = 1;
            } else {
               if (was_off)
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, x,y, cx, cy);
               else
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vline, x,y,0,0);
               was_off = 0;
            }
         }
      }
      num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);
   } else if (numberOfContours == -1) {
      // Compound shapes.
      int more = 1;
      stbtt_uint8 *comp = data + g + 10;
      num_vertices = 0;
      vertices = 0;
      while (more) {
         stbtt_uint16 flags, gidx;
         int comp_num_verts = 0, i;
         stbtt_vertex *comp_verts = 0, *tmp = 0;
         float mtx[6] = {1,0,0,1,0,0}, m, n;
         
         flags = ttSHORT(comp); comp+=2;
         gidx = ttSHORT(comp); comp+=2;

         if (flags & 2) { // XY values
            if (flags & 1) { // shorts
               mtx[4] = ttSHORT(comp); comp+=2;
               mtx[5] = ttSHORT(comp); comp+=2;
            } else {
               mtx[4] = ttCHAR(comp); comp+=1;
               mtx[5] = ttCHAR(comp); comp+=1;
            }
         }
         else {
            // @TODO handle matching point
            STBTT_assert(0);
         }
         if (flags & (1<<3)) { // WE_HAVE_A_SCALE
            mtx[0] = mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
         } else if (flags & (1<<6)) { // WE_HAVE_AN_X_AND_YSCALE
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         } else if (flags & (1<<7)) { // WE_HAVE_A_TWO_BY_TWO
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[2] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         }
         
         // Find transformation scales.
         m = (float) STBTT_sqrt(mtx[0]*mtx[0] + mtx[1]*mtx[1]);
         n = (float) STBTT_sqrt(mtx[2]*mtx[2] + mtx[3]*mtx[3]);

         // Get indexed glyph.
         comp_num_verts = stbtt_GetGlyphShape(info, gidx, &comp_verts);
         if (comp_num_verts > 0) {
            // Transform vertices.
            for (i = 0; i < comp_num_verts; ++i) {
               stbtt_vertex* v = &comp_verts[i];
               stbtt_vertex_type x,y;
               x=v->x; y=v->y;
               v->x = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->y = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
               x=v->cx; y=v->cy;
               v->cx = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->cy = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
            }
            // Append vertices.
            tmp = (stbtt_vertex*)STBTT_malloc((num_vertices+comp_num_verts)*sizeof(stbtt_vertex), info->userdata);
            if (!tmp) {
               if (vertices) STBTT_free(vertices, info->userdata);
               if (comp_verts) STBTT_free(comp_verts, info->userdata);
               return 0;
            }
            if (num_vertices > 0) STBTT_memcpy(tmp, vertices, num_vertices*sizeof(stbtt_vertex));
            STBTT_memcpy(tmp+num_vertices, comp_verts, comp_num_verts*sizeof(stbtt_vertex));
            if (vertices) STBTT_free(vertices, info->userdata);
            vertices = tmp;
            STBTT_free(comp_verts, info->userdata);
            num_vertices += comp_num_verts;
         }
         // More components ?
         more = flags & (1<<5);
      }
   } else if (numberOfContours < 0) {
      // @TODO other compound variations?
      STBTT_assert(0);
   } else {
      // numberOfCounters == 0, do nothing
   }

   *pvertices = vertices;
   return num_vertices;
}